

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void __thiscall
diy::detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
          (ReductionFunctor<void,_diy::RegularSwapPartners> *this,int round_,Callback *reduce_,
          RegularSwapPartners *partners_,Assigner *assigner_)

{
  this->round = round_;
  Catch::clara::std::
  function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::function
            (&this->reduce,reduce_);
  RegularPartners::RegularPartners
            (&(this->partners).super_RegularPartners,&partners_->super_RegularPartners);
  this->assigner = assigner_;
  return;
}

Assistant:

ReductionFunctor(int round_, const Callback& reduce_, const Partners& partners_, const Assigner& assigner_):
                    round(round_), reduce(reduce_), partners(partners_), assigner(assigner_)        {}